

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
write_decimal<unsigned_long_long>
          (arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this,
          unsigned_long_long value)

{
  buffer<char> *pbVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  undefined1 *puVar6;
  byte bVar7;
  uint uVar8;
  ulong __n;
  buffer<char> *c;
  ulong uVar9;
  undefined1 auStack_58 [48];
  
  lVar5 = 0x3f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> lVar5 == 0; lVar5 = lVar5 + -1) {
    }
  }
  uVar8 = ((uint)lVar5 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  __n = (ulong)((uVar8 - (value < *(ulong *)(basic_data<void>::zero_or_powers_of_10_64 +
                                            (ulong)uVar8 * 8))) + 1);
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar9 = sVar2 + __n;
  if (pbVar1->capacity_ < uVar9) {
    (**pbVar1->_vptr_buffer)(pbVar1,uVar9);
  }
  pbVar1->size_ = uVar9;
  puVar6 = auStack_58 + __n;
  uVar9 = value;
  if (99 < value) {
    do {
      value = uVar9 / 100;
      *(undefined2 *)(puVar6 + -2) =
           *(undefined2 *)
            (basic_data<void>::digits + (ulong)(uint)((int)uVar9 + (int)value * -100) * 2);
      puVar6 = puVar6 + -2;
      bVar4 = 9999 < uVar9;
      uVar9 = value;
    } while (bVar4);
  }
  pcVar3 = pbVar1->ptr_;
  if (value < 10) {
    bVar7 = (byte)value | 0x30;
    lVar5 = -1;
  }
  else {
    puVar6[-1] = basic_data<void>::digits[(value * 2 & 0xffffffff) + 1];
    bVar7 = basic_data<void>::digits[value * 2 & 0x1fffffffe];
    lVar5 = -2;
  }
  puVar6[lVar5] = bVar7;
  if (__n != 0) {
    memcpy(pcVar3 + sVar2,auStack_58,__n);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }